

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_compilation.cpp
# Opt level: O2

void __thiscall
pstore::exchange::import_ns::compilation::compilation
          (compilation *this,not_null<context_*> ctxt,not_null<transaction_base_*> transaction,
          not_null<const_string_mapping_*> names,fragment_index_pointer *fragments,digest *digest)

{
  undefined8 uVar1;
  
  (this->super_rule).context_.ptr_ = ctxt.ptr_;
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__compilation_0022f508;
  (this->transaction_).ptr_ = transaction.ptr_;
  (this->names_).ptr_ = names.ptr_;
  std::
  __shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&(this->fragments_).
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,&fragments->
                   super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  uVar1 = *(undefined8 *)((long)&digest->v_ + 8);
  *(long *)&(this->digest_).v_ = (long)digest->v_;
  *(undefined8 *)((long)&(this->digest_).v_ + 8) = uVar1;
  (this->seen_).super__Base_bitset<1UL>._M_w = 0;
  this->triple_ = 0;
  (this->definitions_).
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->definitions_).
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->definitions_).
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

compilation::compilation (not_null<context *> const ctxt,
                                      not_null<transaction_base *> const transaction,
                                      not_null<string_mapping const *> const names,
                                      fragment_index_pointer const & fragments,
                                      index::digest const & digest)
                    : rule (ctxt)
                    , transaction_{transaction}
                    , names_{names}
                    , fragments_{fragments}
                    , digest_{digest} {}